

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ShaderTextureFunctionCase::initTexture(ShaderTextureFunctionCase *this)

{
  pointer *ppTVar1;
  undefined8 uVar2;
  Function FVar3;
  pointer pPVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Texture2D *this_00;
  Texture2DArray *this_01;
  Texture3D *this_02;
  TextureCube *this_03;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  float *pfVar12;
  iterator __position;
  int iVar13;
  long lVar14;
  int face;
  long lVar15;
  byte bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  CubeFaceFloatCoords CVar23;
  CubeFaceFloatCoords CVar24;
  CubeFaceFloatCoords CVar25;
  float local_1ac;
  Vec2 f;
  IVec2 viewportSize;
  TestContext *local_198;
  Vec4 colorA;
  FilterMode local_138;
  float afStack_134 [27];
  Vec4 colorB_2;
  Vec4 colorA_2;
  Vec4 colorB;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  
  bVar16 = 0;
  if (initTexture()::texCubeSwz == '\0') {
    initTexture();
  }
  texFmt = glu::mapGLInternalFormat((this->m_textureSpec).format);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  deqp::gls::ShaderRenderCase::getViewportSize((ShaderRenderCase *)&viewportSize);
  FVar3 = (this->m_lookupSpec).function;
  if ((FVar3 < FUNCTION_TEXELFETCH) && ((0x1b6U >> (FVar3 & 0x1f) & 1) != 0)) {
    bVar5 = FVar3 < FUNCTION_TEXTURELOD && (this->super_ShaderRenderCase).m_isVertexCase == false;
    fVar17 = 1.0 / (this->m_lookupSpec).minCoord.m_data[FVar3 == FUNCTION_TEXTUREPROJ3 ^ 3];
  }
  else {
    bVar5 = FVar3 < FUNCTION_TEXTURELOD && (this->super_ShaderRenderCase).m_isVertexCase == false;
    fVar17 = 1.0;
  }
  switch((this->m_textureSpec).type) {
  case TEXTURETYPE_2D:
    fVar19 = 0.0;
    if (!bVar5) {
      iVar6 = (this->m_textureSpec).numLevels + -1;
      iVar11 = 1;
      if (1 < iVar6) {
        iVar11 = iVar6;
      }
      fVar19 = 1.0 / (float)iVar11;
    }
    iVar11 = (this->m_textureSpec).width;
    iVar6 = (this->m_textureSpec).height;
    iVar9 = iVar11 + 3;
    if (-1 < iVar11) {
      iVar9 = iVar11;
    }
    iVar7 = iVar6 + 3;
    if (-1 < iVar6) {
      iVar7 = iVar6;
    }
    iVar13 = iVar7 >> 2;
    if (iVar9 >> 2 < iVar7 >> 2) {
      iVar13 = iVar9 >> 2;
    }
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               iVar11,iVar6);
    this->m_texture2D = this_00;
    if (0 < (this->m_textureSpec).numLevels) {
      lVar14 = 0;
      lVar15 = 0;
      do {
        fVar18 = (float)(int)lVar15 * fVar19;
        fVar20 = 1.0 - fVar18;
        colorA.m_data[2] =
             fVar18 * (fmtInfo.valueMax.m_data[2] - fmtInfo.valueMin.m_data[2]) +
             fmtInfo.valueMin.m_data[2];
        colorA.m_data[3] =
             fVar20 * (fmtInfo.valueMax.m_data[3] - fmtInfo.valueMin.m_data[3]) +
             fmtInfo.valueMin.m_data[3];
        colorA.m_data[1] =
             fVar20 * (fmtInfo.valueMax.m_data[1] - fmtInfo.valueMin.m_data[1]) +
             fmtInfo.valueMin.m_data[1];
        colorA.m_data[0] =
             fVar18 * (fmtInfo.valueMax.m_data[0] - fmtInfo.valueMin.m_data[0]) +
             fmtInfo.valueMin.m_data[0];
        colorB.m_data[0] =
             fVar20 * (fmtInfo.valueMax.m_data[0] - fmtInfo.valueMin.m_data[0]) +
             fmtInfo.valueMin.m_data[0];
        colorB.m_data[1] =
             fVar18 * (fmtInfo.valueMax.m_data[1] - fmtInfo.valueMin.m_data[1]) +
             fmtInfo.valueMin.m_data[1];
        colorB.m_data[2] =
             fVar20 * (fmtInfo.valueMax.m_data[2] - fmtInfo.valueMin.m_data[2]) +
             fmtInfo.valueMin.m_data[2];
        colorB.m_data[3] =
             fVar18 * (fmtInfo.valueMax.m_data[3] - fmtInfo.valueMin.m_data[3]) +
             fmtInfo.valueMin.m_data[3];
        tcu::Texture2D::allocLevel(&this->m_texture2D->m_refTexture,(int)lVar15);
        iVar11 = iVar13 >> ((byte)lVar15 & 0x1f);
        if (iVar11 < 2) {
          iVar11 = 1;
        }
        tcu::fillWithGrid((PixelBufferAccess *)
                          ((long)(((this->m_texture2D->m_refTexture).super_TextureLevelPyramid.
                                   m_access.
                                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_ConstPixelBufferAccess).m_size.m_data + lVar14 + -8),iVar11,
                          &colorA,&colorB);
        lVar15 = lVar15 + 1;
        lVar14 = lVar14 + 0x28;
      } while (lVar15 < (this->m_textureSpec).numLevels);
      this_00 = this->m_texture2D;
    }
    (*this_00->_vptr_Texture2D[2])();
    fVar17 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width *
                        ((this->m_lookupSpec).maxCoord.m_data[0] -
                        (this->m_lookupSpec).minCoord.m_data[0]) * fVar17) /
                        (float)viewportSize.m_data[0],0.0,0.0,
                        ((float)(this->m_textureSpec).height *
                        ((this->m_lookupSpec).maxCoord.m_data[1] -
                        (this->m_lookupSpec).minCoord.m_data[1]) * fVar17) /
                        (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar17;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_texture2D,&(this->m_textureSpec).sampler);
    break;
  case TEXTURETYPE_CUBE_MAP:
    fVar19 = 0.0;
    if (!bVar5) {
      iVar6 = (this->m_textureSpec).numLevels + -1;
      iVar11 = 1;
      if (1 < iVar6) {
        iVar11 = iVar6;
      }
      fVar19 = 1.0 / (float)iVar11;
    }
    fVar18 = fmtInfo.valueMax.m_data[0] - fmtInfo.valueMin.m_data[0];
    fVar20 = fmtInfo.valueMax.m_data[1] - fmtInfo.valueMin.m_data[1];
    fVar21 = fmtInfo.valueMax.m_data[2] - fmtInfo.valueMin.m_data[2];
    fVar22 = fmtInfo.valueMax.m_data[3] - fmtInfo.valueMin.m_data[3];
    colorB.m_data[0] = fVar18 * 0.5 + fmtInfo.valueMin.m_data[0];
    colorB.m_data[1] = fVar20 * 0.5 + fmtInfo.valueMin.m_data[1];
    colorB.m_data[2] = fVar21 * 0.5 + fmtInfo.valueMin.m_data[2];
    colorB.m_data[3] = fVar22 * 0.5 + fmtInfo.valueMin.m_data[3];
    iVar11 = (this->m_textureSpec).width;
    iVar6 = (this->m_textureSpec).height;
    iVar9 = iVar11 + 3;
    if (-1 < iVar11) {
      iVar9 = iVar11;
    }
    iVar7 = iVar6 + 3;
    if (-1 < iVar6) {
      iVar7 = iVar6;
    }
    iVar6 = iVar7 >> 2;
    if (iVar9 >> 2 < iVar7 >> 2) {
      iVar6 = iVar9 >> 2;
    }
    this_03 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube
              (this_03,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               iVar11);
    this->m_textureCube = this_03;
    if (0 < (this->m_textureSpec).numLevels) {
      local_198 = (TestContext *)0x0;
      lVar14 = 0;
      do {
        f.m_data[0] = (float)(int)lVar14 * fVar19;
        f.m_data[1] = 1.0 - f.m_data[0];
        iVar11 = iVar6 >> ((byte)lVar14 & 0x1f);
        if (iVar11 < 2) {
          iVar11 = 1;
        }
        lVar15 = 0;
        do {
          colorA_2.m_data[0] =
               f.m_data[initTexture::texCubeSwz[lVar15].m_data[0]] * fVar18 +
               fmtInfo.valueMin.m_data[0];
          colorA_2.m_data[1] =
               f.m_data[initTexture::texCubeSwz[lVar15].m_data[1]] * fVar20 +
               fmtInfo.valueMin.m_data[1];
          colorA_2.m_data[2] =
               f.m_data[initTexture::texCubeSwz[lVar15].m_data[2]] * fVar21 +
               fmtInfo.valueMin.m_data[2];
          colorA_2.m_data[3] =
               f.m_data[initTexture::texCubeSwz[lVar15].m_data[3]] * fVar22 +
               fmtInfo.valueMin.m_data[3];
          colorB_2.m_data[0] =
               f.m_data[1 - initTexture::texCubeSwz[lVar15].m_data[0]] * fVar18 +
               fmtInfo.valueMin.m_data[0];
          colorB_2.m_data[1] =
               f.m_data[1 - initTexture::texCubeSwz[lVar15].m_data[1]] * fVar20 +
               fmtInfo.valueMin.m_data[1];
          colorB_2.m_data[2] =
               f.m_data[1 - initTexture::texCubeSwz[lVar15].m_data[2]] * fVar21 +
               fmtInfo.valueMin.m_data[2];
          colorB_2.m_data[3] =
               f.m_data[1 - initTexture::texCubeSwz[lVar15].m_data[3]] * fVar22 +
               fmtInfo.valueMin.m_data[3];
          tcu::TextureCube::allocLevel
                    (&this->m_textureCube->m_refTexture,(CubeFace)lVar15,(int)lVar14);
          pPVar4 = (this->m_textureCube->m_refTexture).m_access[lVar15].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          colorA.m_data._0_8_ = pPVar4[lVar14].super_ConstPixelBufferAccess.m_format;
          lVar10 = 2;
          do {
            colorA.m_data[lVar10] =
                 *(float *)((long)&local_198->m_platform +
                           (long)((pPVar4->super_ConstPixelBufferAccess).m_size.m_data + lVar10 + -2
                                 ));
            lVar10 = lVar10 + 1;
          } while (lVar10 != 5);
          lVar10 = 5;
          do {
            colorA.m_data[lVar10] =
                 *(float *)((long)&local_198->m_platform +
                           (long)((pPVar4->super_ConstPixelBufferAccess).m_size.m_data + lVar10 + -2
                                 ));
            lVar10 = lVar10 + 1;
          } while (lVar10 != 8);
          iVar9 = (int)colorA.m_data[2] + -1;
          tcu::fillWithGrid((PixelBufferAccess *)&colorA,iVar11,&colorA_2,&colorB_2);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&colorA,&colorB,0,0,0);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&colorA,&colorB,0,iVar9,0);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&colorA,&colorB,iVar9,0,0);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&colorA,&colorB,iVar9,iVar9,0);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 6);
        lVar14 = lVar14 + 1;
        local_198 = (TestContext *)&local_198->m_curArchive;
      } while (lVar14 < (this->m_textureSpec).numLevels);
      this_03 = this->m_textureCube;
    }
    glu::TextureCube::upload(this_03);
    colorA.m_data[2] = (this->m_lookupSpec).minCoord.m_data[2] * fVar17;
    uVar2 = *(undefined8 *)(this->m_lookupSpec).minCoord.m_data;
    colorA.m_data[1] = (float)((ulong)uVar2 >> 0x20) * fVar17;
    colorA.m_data[0] = (float)uVar2 * fVar17;
    CVar23 = tcu::getCubeFaceCoords((Vec3 *)&colorA);
    colorA.m_data[2] = (this->m_lookupSpec).minCoord.m_data[2] * fVar17;
    colorA.m_data[0] = (this->m_lookupSpec).maxCoord.m_data[0] * fVar17;
    colorA.m_data[1] = (this->m_lookupSpec).minCoord.m_data[1] * fVar17;
    CVar24 = tcu::getCubeFaceCoords((Vec3 *)&colorA);
    colorA.m_data[2] = fVar17 * (this->m_lookupSpec).minCoord.m_data[2];
    colorA.m_data[0] = (this->m_lookupSpec).minCoord.m_data[0] * fVar17;
    colorA.m_data[1] = (this->m_lookupSpec).maxCoord.m_data[1] * fVar17;
    CVar25 = tcu::getCubeFaceCoords((Vec3 *)&colorA);
    fVar17 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width * (CVar24.s - CVar23.s)) /
                        (float)viewportSize.m_data[0],0.0,0.0,
                        ((float)(this->m_textureSpec).height * (CVar25.t - CVar23.t)) /
                        (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar17;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_textureCube,&(this->m_textureSpec).sampler);
    break;
  case TEXTURETYPE_2D_ARRAY:
    iVar11 = (this->m_textureSpec).depth;
    local_1ac = 0.0;
    if (!bVar5) {
      iVar9 = (this->m_textureSpec).numLevels + -1;
      iVar6 = 1;
      if (1 < iVar9) {
        iVar6 = iVar9;
      }
      local_1ac = 1.0 / (float)(iVar6 * iVar11);
    }
    iVar6 = (this->m_textureSpec).width;
    iVar9 = (this->m_textureSpec).height;
    iVar7 = iVar6 + 3;
    if (-1 < iVar6) {
      iVar7 = iVar6;
    }
    iVar13 = iVar9 + 3;
    if (-1 < iVar9) {
      iVar13 = iVar9;
    }
    iVar8 = iVar13 >> 2;
    if (iVar7 >> 2 < iVar13 >> 2) {
      iVar8 = iVar7 >> 2;
    }
    this_01 = (Texture2DArray *)operator_new(0x70);
    glu::Texture2DArray::Texture2DArray
              (this_01,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,iVar6
               ,iVar9,iVar11);
    this->m_texture2DArray = this_01;
    if (0 < (this->m_textureSpec).numLevels) {
      lVar15 = 0;
      lVar14 = 0;
      do {
        tcu::Texture2DArray::allocLevel(&this->m_texture2DArray->m_refTexture,(int)lVar14);
        pPVar4 = (this->m_texture2DArray->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        colorA.m_data._0_8_ = pPVar4[lVar14].super_ConstPixelBufferAccess.m_format;
        lVar10 = 2;
        do {
          colorA.m_data[lVar10] =
               *(float *)((long)(pPVar4->super_ConstPixelBufferAccess).m_size.m_data +
                         lVar10 * 4 + lVar15 + -8);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 5);
        lVar10 = 5;
        do {
          colorA.m_data[lVar10] =
               *(float *)((long)(pPVar4->super_ConstPixelBufferAccess).m_size.m_data +
                         lVar10 * 4 + lVar15 + -8);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        if (0 < (int)local_138) {
          iVar6 = iVar8 >> ((byte)lVar14 & 0x1f);
          if (iVar6 < 2) {
            iVar6 = 1;
          }
          iVar9 = 0;
          do {
            fVar19 = (float)iVar9 * (1.0 / (float)iVar11) + (float)(int)lVar14 * local_1ac;
            fVar18 = 1.0 - fVar19;
            colorA_2.m_data[0] =
                 fVar19 * (fmtInfo.valueMax.m_data[0] - fmtInfo.valueMin.m_data[0]) +
                 fmtInfo.valueMin.m_data[0];
            colorA_2.m_data[1] =
                 fVar18 * (fmtInfo.valueMax.m_data[1] - fmtInfo.valueMin.m_data[1]) +
                 fmtInfo.valueMin.m_data[1];
            colorA_2.m_data[2] =
                 fVar19 * (fmtInfo.valueMax.m_data[2] - fmtInfo.valueMin.m_data[2]) +
                 fmtInfo.valueMin.m_data[2];
            colorA_2.m_data[3] =
                 fVar18 * (fmtInfo.valueMax.m_data[3] - fmtInfo.valueMin.m_data[3]) +
                 fmtInfo.valueMin.m_data[3];
            colorB_2.m_data[0] =
                 fVar18 * (fmtInfo.valueMax.m_data[0] - fmtInfo.valueMin.m_data[0]) +
                 fmtInfo.valueMin.m_data[0];
            colorB_2.m_data[1] =
                 fVar19 * (fmtInfo.valueMax.m_data[1] - fmtInfo.valueMin.m_data[1]) +
                 fmtInfo.valueMin.m_data[1];
            colorB_2.m_data[2] =
                 fVar18 * (fmtInfo.valueMax.m_data[2] - fmtInfo.valueMin.m_data[2]) +
                 fmtInfo.valueMin.m_data[2];
            colorB_2.m_data[3] =
                 fVar19 * (fmtInfo.valueMax.m_data[3] - fmtInfo.valueMin.m_data[3]) +
                 fmtInfo.valueMin.m_data[3];
            tcu::getSubregion((PixelBufferAccess *)&colorB,(PixelBufferAccess *)&colorA,0,0,iVar9,
                              (int)colorA.m_data[2],(int)colorA.m_data[3],1);
            tcu::fillWithGrid((PixelBufferAccess *)&colorB,iVar6,&colorA_2,&colorB_2);
            iVar9 = iVar9 + 1;
          } while (iVar9 < (int)local_138);
        }
        lVar14 = lVar14 + 1;
        lVar15 = lVar15 + 0x28;
      } while (lVar14 < (this->m_textureSpec).numLevels);
      this_01 = this->m_texture2DArray;
    }
    glu::Texture2DArray::upload(this_01);
    fVar17 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width *
                        ((this->m_lookupSpec).maxCoord.m_data[0] -
                        (this->m_lookupSpec).minCoord.m_data[0]) * fVar17) /
                        (float)viewportSize.m_data[0],0.0,0.0,
                        ((float)(this->m_textureSpec).height *
                        ((this->m_lookupSpec).maxCoord.m_data[1] -
                        (this->m_lookupSpec).minCoord.m_data[1]) * fVar17) /
                        (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar17;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_texture2DArray,&(this->m_textureSpec).sampler);
    break;
  case TEXTURETYPE_3D:
    fVar19 = 0.0;
    if (!bVar5) {
      iVar6 = (this->m_textureSpec).numLevels + -1;
      iVar11 = 1;
      if (1 < iVar6) {
        iVar11 = iVar6;
      }
      fVar19 = 1.0 / (float)iVar11;
    }
    iVar11 = (this->m_textureSpec).width;
    iVar6 = (this->m_textureSpec).height;
    iVar7 = iVar11 / 2;
    iVar9 = iVar6 / 2;
    if (iVar7 < iVar9) {
      iVar9 = iVar7;
    }
    iVar7 = (this->m_textureSpec).depth;
    iVar13 = iVar7 / 2;
    if (iVar9 < iVar13) {
      iVar13 = iVar9;
    }
    this_02 = (Texture3D *)operator_new(0x70);
    glu::Texture3D::Texture3D
              (this_02,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               iVar11,iVar6,iVar7);
    this->m_texture3D = this_02;
    if (0 < (this->m_textureSpec).numLevels) {
      lVar14 = 0;
      lVar15 = 0;
      do {
        fVar18 = (float)(int)lVar15 * fVar19;
        fVar20 = 1.0 - fVar18;
        colorA.m_data[2] =
             fVar18 * (fmtInfo.valueMax.m_data[2] - fmtInfo.valueMin.m_data[2]) +
             fmtInfo.valueMin.m_data[2];
        colorA.m_data[3] =
             fVar20 * (fmtInfo.valueMax.m_data[3] - fmtInfo.valueMin.m_data[3]) +
             fmtInfo.valueMin.m_data[3];
        colorA.m_data[1] =
             fVar20 * (fmtInfo.valueMax.m_data[1] - fmtInfo.valueMin.m_data[1]) +
             fmtInfo.valueMin.m_data[1];
        colorA.m_data[0] =
             fVar18 * (fmtInfo.valueMax.m_data[0] - fmtInfo.valueMin.m_data[0]) +
             fmtInfo.valueMin.m_data[0];
        colorB.m_data[0] =
             fVar20 * (fmtInfo.valueMax.m_data[0] - fmtInfo.valueMin.m_data[0]) +
             fmtInfo.valueMin.m_data[0];
        colorB.m_data[1] =
             fVar18 * (fmtInfo.valueMax.m_data[1] - fmtInfo.valueMin.m_data[1]) +
             fmtInfo.valueMin.m_data[1];
        colorB.m_data[2] =
             fVar20 * (fmtInfo.valueMax.m_data[2] - fmtInfo.valueMin.m_data[2]) +
             fmtInfo.valueMin.m_data[2];
        colorB.m_data[3] =
             fVar18 * (fmtInfo.valueMax.m_data[3] - fmtInfo.valueMin.m_data[3]) +
             fmtInfo.valueMin.m_data[3];
        tcu::Texture3D::allocLevel(&this->m_texture3D->m_refTexture,(int)lVar15);
        iVar11 = iVar13 >> ((byte)lVar15 & 0x1f);
        if (iVar11 < 2) {
          iVar11 = 1;
        }
        tcu::fillWithGrid((PixelBufferAccess *)
                          ((long)(((this->m_texture3D->m_refTexture).super_TextureLevelPyramid.
                                   m_access.
                                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_ConstPixelBufferAccess).m_size.m_data + lVar14 + -8),iVar11,
                          &colorA,&colorB);
        lVar15 = lVar15 + 1;
        lVar14 = lVar14 + 0x28;
      } while (lVar15 < (this->m_textureSpec).numLevels);
      this_02 = this->m_texture3D;
    }
    glu::Texture3D::upload(this_02);
    fVar19 = (float)(this->m_textureSpec).depth *
             ((this->m_lookupSpec).maxCoord.m_data[2] - (this->m_lookupSpec).minCoord.m_data[2]) *
             0.5 * fVar17;
    fVar17 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width *
                        ((this->m_lookupSpec).maxCoord.m_data[0] -
                        (this->m_lookupSpec).minCoord.m_data[0]) * fVar17) /
                        (float)viewportSize.m_data[0],0.0,fVar19 / (float)viewportSize.m_data[0],0.0
                        ,((float)(this->m_textureSpec).height *
                         ((this->m_lookupSpec).maxCoord.m_data[1] -
                         (this->m_lookupSpec).minCoord.m_data[1]) * fVar17) /
                         (float)viewportSize.m_data[1],fVar19 / (float)viewportSize.m_data[1]);
    (this->m_lookupParams).lod = fVar17;
    deqp::gls::TextureBinding::TextureBinding
              ((TextureBinding *)&colorA,this->m_texture3D,&(this->m_textureSpec).sampler);
    break;
  default:
    goto switchD_01104790_default;
  }
  __position._M_current =
       (this->super_ShaderRenderCase).m_textures.
       super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_ShaderRenderCase).m_textures.
      super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
    _M_realloc_insert<deqp::gls::TextureBinding>
              (&(this->super_ShaderRenderCase).m_textures,__position,(TextureBinding *)&colorA);
  }
  else {
    lVar14 = 9;
    pfVar12 = colorA.m_data;
    for (; lVar14 != 0; lVar14 = lVar14 + -1) {
      fVar17 = pfVar12[1];
      (__position._M_current)->m_type = (Type)pfVar12[0];
      ((__position._M_current)->m_sampler).wrapS = (WrapMode)fVar17;
      pfVar12 = pfVar12 + (ulong)bVar16 * 0xfffffffffffffffc + 2;
      __position._M_current = __position._M_current + (ulong)bVar16 * -0x10 + 8;
    }
    ppTVar1 = &(this->super_ShaderRenderCase).m_textures.
               super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
switchD_01104790_default:
  *(undefined8 *)(this->m_lookupParams).scale.m_data = fmtInfo.lookupScale.m_data._0_8_;
  *(undefined8 *)((this->m_lookupParams).scale.m_data + 2) = fmtInfo.lookupScale.m_data._8_8_;
  *(undefined8 *)(this->m_lookupParams).bias.m_data = fmtInfo.lookupBias.m_data._0_8_;
  *(undefined8 *)((this->m_lookupParams).bias.m_data + 2) = fmtInfo.lookupBias.m_data._8_8_;
  *(undefined8 *)(this->m_lookupParams).offset.m_data =
       *(undefined8 *)(this->m_lookupSpec).offset.m_data;
  (this->m_lookupParams).offset.m_data[2] = (this->m_lookupSpec).offset.m_data[2];
  return;
}

Assistant:

void ShaderTextureFunctionCase::initTexture (void)
{
	static const IVec4 texCubeSwz[] =
	{
		IVec4(0,0,1,1),
		IVec4(1,1,0,0),
		IVec4(0,1,0,1),
		IVec4(1,0,1,0),
		IVec4(0,1,1,0),
		IVec4(1,0,0,1)
	};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(texCubeSwz) == tcu::CUBEFACE_LAST);

	tcu::TextureFormat		texFmt			= glu::mapGLInternalFormat(m_textureSpec.format);
	tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	tcu::IVec2				viewportSize	= getViewportSize();
	bool					isProj			= functionHasProj(m_lookupSpec.function);
	bool					isAutoLod		= functionHasAutoLod(m_isVertexCase ? glu::SHADERTYPE_VERTEX : glu::SHADERTYPE_FRAGMENT,
																 m_lookupSpec.function); // LOD can vary significantly
	float					proj			= isProj ? 1.0f/m_lookupSpec.minCoord[m_lookupSpec.function == FUNCTION_TEXTUREPROJ3 ? 2 : 3] : 1.0f;

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:
		{
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			m_texture2D = new glu::Texture2D(m_renderCtx, m_textureSpec.format, m_textureSpec.width, m_textureSpec.height);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*levelStep;
				float	fB		= 1.0f-fA;
				Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
				Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

				m_texture2D->getRefTexture().allocLevel(level);
				tcu::fillWithGrid(m_texture2D->getRefTexture().getLevel(level), de::max(1, baseCellSize>>level), colorA, colorB);
			}
			m_texture2D->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height	/ (float)viewportSize[1];
			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, 0.0f, dvdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture2D, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_CUBE_MAP:
		{
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			Vec4	cCorner			= cBias + cScale*0.5f;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			DE_ASSERT(m_textureSpec.width == m_textureSpec.height);
			m_textureCube = new glu::TextureCube(m_renderCtx, m_textureSpec.format, m_textureSpec.width);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*levelStep;
				float	fB		= 1.0f-fA;
				Vec2	f		(fA, fB);

				for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				{
					const IVec4&	swzA	= texCubeSwz[face];
					IVec4			swzB	= 1-swzA;
					Vec4			colorA	= cBias + cScale*f.swizzle(swzA[0], swzA[1], swzA[2], swzA[3]);
					Vec4			colorB	= cBias + cScale*f.swizzle(swzB[0], swzB[1], swzB[2], swzB[3]);

					m_textureCube->getRefTexture().allocLevel((tcu::CubeFace)face, level);

					{
						const tcu::PixelBufferAccess	access		= m_textureCube->getRefTexture().getLevelFace(level, (tcu::CubeFace)face);
						const int						lastPix		= access.getWidth()-1;

						tcu::fillWithGrid(access, de::max(1, baseCellSize>>level), colorA, colorB);

						// Ensure all corners have identical colors in order to avoid dealing with ambiguous corner texel filtering
						access.setPixel(cCorner, 0, 0);
						access.setPixel(cCorner, 0, lastPix);
						access.setPixel(cCorner, lastPix, 0);
						access.setPixel(cCorner, lastPix, lastPix);
					}
				}
			}
			m_textureCube->upload();

			// Compute LOD \note Assumes that only single side is accessed and R is constant major axis.
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[2] - m_lookupSpec.maxCoord[2]) < 0.005);
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[0]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[0]) < de::abs(m_lookupSpec.minCoord[2]));
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[1]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[1]) < de::abs(m_lookupSpec.minCoord[2]));

			tcu::CubeFaceFloatCoords	c00		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c10		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.maxCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c01		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.maxCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			float						dudx	= (c10.s - c00.s)*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float						dvdy	= (c01.t - c00.t)*(float)m_textureSpec.height	/ (float)viewportSize[1];

			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, 0.0f, dvdy);

			m_textures.push_back(gls::TextureBinding(m_textureCube, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_2D_ARRAY:
		{
			float	layerStep		= 1.0f / (float)m_textureSpec.depth;
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)(de::max(1, m_textureSpec.numLevels-1)*m_textureSpec.depth);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			m_texture2DArray = new glu::Texture2DArray(m_renderCtx, m_textureSpec.format, m_textureSpec.width, m_textureSpec.height, m_textureSpec.depth);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				m_texture2DArray->getRefTexture().allocLevel(level);
				tcu::PixelBufferAccess levelAccess = m_texture2DArray->getRefTexture().getLevel(level);

				for (int layer = 0; layer < levelAccess.getDepth(); layer++)
				{
					float	fA		= (float)layer*layerStep + (float)level*levelStep;
					float	fB		= 1.0f-fA;
					Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
					Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

					tcu::fillWithGrid(tcu::getSubregion(levelAccess, 0, 0, layer, levelAccess.getWidth(), levelAccess.getHeight(), 1), de::max(1, baseCellSize>>level), colorA, colorB);
				}
			}
			m_texture2DArray->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height	/ (float)viewportSize[1];
			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, 0.0f, dvdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture2DArray, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_3D:
		{
			float	levelStep		= isAutoLod ? 0.0f : 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(de::min(m_textureSpec.width/2, m_textureSpec.height/2), m_textureSpec.depth/2);

			m_texture3D = new glu::Texture3D(m_renderCtx, m_textureSpec.format, m_textureSpec.width, m_textureSpec.height, m_textureSpec.depth);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= (float)level*levelStep;
				float	fB		= 1.0f-fA;
				Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
				Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

				m_texture3D->getRefTexture().allocLevel(level);
				tcu::fillWithGrid(m_texture3D->getRefTexture().getLevel(level), de::max(1, baseCellSize>>level), colorA, colorB);
			}
			m_texture3D->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width		/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height		/ (float)viewportSize[1];
			float dwdx = (m_lookupSpec.maxCoord[2]-m_lookupSpec.minCoord[2])*0.5f*proj*(float)m_textureSpec.depth	/ (float)viewportSize[0];
			float dwdy = (m_lookupSpec.maxCoord[2]-m_lookupSpec.minCoord[2])*0.5f*proj*(float)m_textureSpec.depth	/ (float)viewportSize[1];
			m_lookupParams.lod = computeLodFromDerivates(DEFAULT_LOD_MODE, dudx, 0.0f, dwdx, 0.0f, dvdy, dwdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture3D, m_textureSpec.sampler));
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Set lookup scale & bias
	m_lookupParams.scale	= fmtInfo.lookupScale;
	m_lookupParams.bias		= fmtInfo.lookupBias;
	m_lookupParams.offset	= m_lookupSpec.offset;
}